

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cpp
# Opt level: O1

string * leftJustify(string *__return_storage_ptr__,string *input,int width)

{
  long lVar1;
  uint uVar2;
  long *plVar3;
  size_type *psVar4;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  uVar2 = utf8_text_width(input);
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct((ulong)local_48,(char)width - (char)uVar2);
  plVar3 = (long *)std::__cxx11::string::replace
                             ((ulong)local_48,0,(char *)0x0,(ulong)(input->_M_dataplus)._M_p);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar4) {
    lVar1 = plVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
  }
  __return_storage_ptr__->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string leftJustify (const std::string& input, const int width)
{
  return input + std::string (width - utf8_text_width (input), ' ');
}